

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddNeg.c
# Opt level: O1

DdNode * cuddAddNegateRecur(DdManager *dd,DdNode *f)

{
  int *piVar1;
  DdNode *pDVar2;
  DdNode *T;
  DdNode *data;
  
  if (f->index == 0x7fffffff) {
    pDVar2 = cuddUniqueConst(dd,-(double)(f->type).kids.T);
    return pDVar2;
  }
  pDVar2 = cuddCacheLookup1(dd,Cudd_addNegate,f);
  if (pDVar2 == (DdNode *)0x0) {
    pDVar2 = (f->type).kids.E;
    T = cuddAddNegateRecur(dd,(f->type).kids.T);
    if (T != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar2 = cuddAddNegateRecur(dd,pDVar2);
      if (pDVar2 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        data = T;
        if (T != pDVar2) {
          data = cuddUniqueInter(dd,f->index,T,pDVar2);
        }
        if (data != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          cuddCacheInsert1(dd,Cudd_addNegate,f,data);
          return data;
        }
        Cudd_RecursiveDeref(dd,T);
        T = pDVar2;
      }
      Cudd_RecursiveDeref(dd,T);
    }
    pDVar2 = (DdNode *)0x0;
  }
  return pDVar2;
}

Assistant:

DdNode *
cuddAddNegateRecur(
  DdManager * dd,
  DdNode * f)
{
    DdNode *res,
            *fv, *fvn,
            *T, *E;

    statLine(dd);
    /* Check terminal cases. */
    if (cuddIsConstant(f)) {
        res = cuddUniqueConst(dd,-cuddV(f));
        return(res);
    }

    /* Check cache */
    res = cuddCacheLookup1(dd,Cudd_addNegate,f);
    if (res != NULL) return(res);

    /* Recursive Step */
    fv = cuddT(f);
    fvn = cuddE(f);
    T = cuddAddNegateRecur(dd,fv);
    if (T == NULL) return(NULL);
    cuddRef(T);

    E = cuddAddNegateRecur(dd,fvn);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd,T);
        return(NULL);
    }
    cuddRef(E);
    res = (T == E) ? T : cuddUniqueInter(dd,(int)f->index,T,E);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd, T);
        Cudd_RecursiveDeref(dd, E);
        return(NULL);
    }
    cuddDeref(T);
    cuddDeref(E);

    /* Store result. */
    cuddCacheInsert1(dd,Cudd_addNegate,f,res);

    return(res);

}